

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

void SingleTreeSearchHelper
               (ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
               ON_RTreePairSearchCallbackResult *a_result)

{
  int iVar1;
  bool bVar2;
  ON__INT_PTR *pOVar3;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  
  iVar1 = a_nodeA->m_count;
  if (a_nodeA->m_level < 1) {
    if (0 < iVar1) {
      paVar4 = &a_nodeA->m_branch[0].field_1;
      do {
        if (((ON_RTreeBranch *)(paVar4 + -6) < a_branchB) &&
           (bVar2 = PairSearchOverlapHelper
                              ((ON_RTreeBBox *)(paVar4 + -6),&a_branchB->m_rect,
                               a_result->m_tolerance), bVar2)) {
          (*a_result->m_resultCallback)
                    (a_result->m_context,(ON__INT_PTR)paVar4->m_child,
                     (ON__INT_PTR)(a_branchB->field_1).m_child);
        }
        pOVar3 = (ON__INT_PTR *)(paVar4 + 1);
        paVar4 = paVar4 + 7;
      } while (pOVar3 < a_nodeA->m_branch + iVar1);
    }
  }
  else if (a_nodeA < &a_nodeA->m_branch[(long)iVar1 + -1].field_1) {
    paVar4 = &a_nodeA->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        ((ON_RTreeBBox *)(paVar4 + -6),&a_branchB->m_rect,a_result->m_tolerance);
      if (bVar2) {
        SingleTreeSearchHelper(paVar4->m_child,a_branchB,a_result);
      }
      pOVar3 = (ON__INT_PTR *)(paVar4 + 1);
      paVar4 = paVar4 + 7;
    } while (pOVar3 < a_nodeA->m_branch + iVar1);
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;

  if (a_nodeA->m_level > 0)
  {
    // branchA's have children nodes and a_branchB is a leaf
    while (branchA < branchAmax)
    {
      if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
      {
        SingleTreeSearchHelper(branchA->m_child, a_branchB, a_result);
      }
      branchA++;
    }
  }
  else
  {
    // branchA's are all leaves
    while (branchA < branchAmax)
    {
      if (branchA < a_branchB)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
        {
          a_result->m_resultCallback(a_result->m_context, branchA->m_id, a_branchB->m_id);
        }
      }
      branchA++;
    }
  }
}